

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOStreamLogStream.h
# Opt level: O1

ssize_t __thiscall
Assimp::StdOStreamLogStream::write(StdOStreamLogStream *this,int __fd,void *__buf,size_t __n)

{
  ostream *poVar1;
  size_t sVar2;
  ssize_t sVar3;
  undefined4 in_register_00000034;
  char *__s;
  
  __s = (char *)CONCAT44(in_register_00000034,__fd);
  poVar1 = this->mOstream;
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
  }
  sVar3 = std::ostream::flush();
  return sVar3;
}

Assistant:

inline void StdOStreamLogStream::write(const char* message) {
    mOstream << message;
    mOstream.flush();
}